

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLayout.cpp
# Opt level: O0

void __thiscall SimpleLayout::Layout(SimpleLayout *this)

{
  LabelInstr *pLVar1;
  bool bVar2;
  IRKind IVar3;
  uint sourceContextId;
  uint functionId;
  PragmaInstr *pPVar4;
  LabelInstr *pLVar5;
  Instr *pIVar6;
  BranchInstr *pBVar7;
  LabelInstr *pLVar8;
  BranchInstr *pBVar9;
  Func *local_c0;
  uint32 local_b4;
  bool local_a1;
  LabelInstr *local_a0;
  BranchInstr *branchInstr;
  BranchInstr *lastOpHelperBranchInstr;
  Instr *lastOpHelperInstr;
  Instr *prevPrevInstr;
  BranchInstr *prevBranchInstr;
  Instr *prevInstr;
  LabelInstr *labelInstr;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  Func *lastOpHelperFunc;
  LabelInstr *pLStack_28;
  uint32 lastOpHelperStatementIndex;
  LabelInstr *lastOpHelperLabel;
  Instr *lastInstr;
  SimpleLayout *this_local;
  
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,LayoutPhase,sourceContextId,functionId);
  if ((!bVar2) &&
     (bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), !bVar2)) {
    lastOpHelperLabel = (LabelInstr *)this->func->m_tailInstr;
    pLStack_28 = (LabelInstr *)0x0;
    lastOpHelperFunc._4_4_ = 0xffffffff;
    instrNext = (Instr *)0x0;
    if (this->func->m_tailInstr->m_prev == (Instr *)0x0) {
      local_a0 = (LabelInstr *)0x0;
    }
    else {
      local_a0 = (LabelInstr *)this->func->m_tailInstr->m_prev->m_next;
    }
    pLVar1 = (LabelInstr *)this->func->m_headInstr;
    while (labelInstr = pLVar1, labelInstr != local_a0) {
      pLVar1 = (LabelInstr *)(labelInstr->super_Instr).m_next;
      bVar2 = IR::Instr::IsPragmaInstr(&labelInstr->super_Instr);
      if ((bVar2) && ((labelInstr->super_Instr).m_opcode == StatementBoundary)) {
        pPVar4 = IR::Instr::AsPragmaInstr(&labelInstr->super_Instr);
        this->currentStatement = pPVar4;
      }
      else {
        IVar3 = IR::Instr::GetKind(&labelInstr->super_Instr);
        local_a1 = true;
        if (IVar3 != InstrKindLabel) {
          local_a1 = IR::Instr::IsProfiledLabelInstr(&labelInstr->super_Instr);
        }
        if (local_a1 != false) {
          pLVar5 = IR::Instr::AsLabelInstr(&labelInstr->super_Instr);
          if (((byte)pLVar5->field_0x78 >> 1 & 1) == 0) {
            if (pLStack_28 != (LabelInstr *)0x0) {
              pIVar6 = IR::Instr::GetPrevRealInstrOrLabel(&pLStack_28->super_Instr);
              bVar2 = IR::Instr::IsBranchInstr(pIVar6);
              if (bVar2) {
                pBVar7 = IR::Instr::AsBranchInstr(pIVar6);
                pLVar8 = IR::BranchInstr::GetTarget(pBVar7);
                if (pLVar8 == pLVar5) {
                  lastOpHelperLabel =
                       (LabelInstr *)
                       MoveHelperBlock(this,&pLStack_28->super_Instr,lastOpHelperFunc._4_4_,
                                       (Func *)instrNext,pLVar5,&lastOpHelperLabel->super_Instr);
                  bVar2 = IR::BranchInstr::IsUnconditional(pBVar7);
                  if (bVar2) {
                    IR::Instr::Remove(&pBVar7->super_Instr);
                  }
                  else {
                    LowererMD::InvertBranch(pBVar7);
                    IR::BranchInstr::SetTarget(pBVar7,pLStack_28);
                  }
                }
                else {
                  bVar2 = IR::BranchInstr::IsUnconditional(pBVar7);
                  if (bVar2) {
                    pIVar6 = IR::Instr::GetPrevRealInstrOrLabel(pIVar6);
                    bVar2 = IR::Instr::IsBranchInstr(pIVar6);
                    if (bVar2) {
                      pBVar9 = IR::Instr::AsBranchInstr(pIVar6);
                      bVar2 = IR::BranchInstr::IsConditional(pBVar9);
                      if (bVar2) {
                        pBVar9 = IR::Instr::AsBranchInstr(pIVar6);
                        pLVar8 = IR::BranchInstr::GetTarget(pBVar9);
                        if (pLVar8 == pLVar5) {
                          lastOpHelperLabel =
                               (LabelInstr *)
                               MoveHelperBlock(this,&pLStack_28->super_Instr,lastOpHelperFunc._4_4_,
                                               (Func *)instrNext,pLVar5,
                                               &lastOpHelperLabel->super_Instr);
                          pBVar9 = IR::Instr::AsBranchInstr(pIVar6);
                          LowererMD::InvertBranch(pBVar9);
                          pBVar9 = IR::Instr::AsBranchInstr(pIVar6);
                          pLVar5 = IR::BranchInstr::GetTarget(pBVar7);
                          IR::BranchInstr::SetTarget(pBVar9,pLVar5);
                          IR::Instr::Remove(&pBVar7->super_Instr);
                          goto LAB_008462f5;
                        }
                      }
                    }
                    pIVar6 = IR::Instr::GetPrevRealInstr(&pLVar5->super_Instr);
                    bVar2 = IR::Instr::IsBranchInstr(pIVar6);
                    if (bVar2) {
                      pBVar7 = IR::Instr::AsBranchInstr(pIVar6);
                      lastOpHelperLabel =
                           (LabelInstr *)
                           MoveHelperBlock(this,&pLStack_28->super_Instr,lastOpHelperFunc._4_4_,
                                           (Func *)instrNext,pLVar5,&lastOpHelperLabel->super_Instr)
                      ;
                      bVar2 = IR::BranchInstr::IsUnconditional(pBVar7);
                      if (!bVar2) {
                        pBVar9 = IR::BranchInstr::New(JMP,pLVar5,this->func);
                        IR::Instr::InsertAfter(&pBVar7->super_Instr,&pBVar9->super_Instr);
                      }
                    }
                  }
                }
              }
LAB_008462f5:
              pLStack_28 = (LabelInstr *)0x0;
            }
          }
          else if (pLStack_28 == (LabelInstr *)0x0) {
            if (this->currentStatement == (PragmaInstr *)0x0) {
              local_b4 = 0xffffffff;
            }
            else {
              local_b4 = this->currentStatement->m_statementIndex;
            }
            lastOpHelperFunc._4_4_ = local_b4;
            if (this->currentStatement == (PragmaInstr *)0x0) {
              local_c0 = (Func *)0x0;
            }
            else {
              local_c0 = (this->currentStatement->super_Instr).m_func;
            }
            instrNext = (Instr *)local_c0;
            pLStack_28 = pLVar5;
          }
        }
      }
    }
    this->func->m_tailInstr = &lastOpHelperLabel->super_Instr;
  }
  return;
}

Assistant:

void
SimpleLayout::Layout()
{
    if (PHASE_OFF(Js::LayoutPhase, this->func) || CONFIG_ISENABLED(Js::DebugFlag))
    {
        return;
    }

    // Do simple layout of helper block.  Push them to after FunctionExit.

    IR::Instr * lastInstr = func->m_tailInstr;
    IR::LabelInstr * lastOpHelperLabel = NULL;
    uint32 lastOpHelperStatementIndex = Js::Constants::NoStatementIndex;
    Func* lastOpHelperFunc = nullptr;
    FOREACH_INSTR_EDITING_IN_RANGE(instr, instrNext, func->m_headInstr, func->m_tailInstr->m_prev)
    {
        if (instr->IsPragmaInstr() && instr->m_opcode == Js::OpCode::StatementBoundary)
        {
            currentStatement = instr->AsPragmaInstr();
        }
        else if (instr->IsLabelInstr())
        {
            IR::LabelInstr * labelInstr = instr->AsLabelInstr();
            if (labelInstr->isOpHelper)
            {
                if (lastOpHelperLabel == NULL)
                {
                    lastOpHelperLabel = labelInstr;
                    lastOpHelperStatementIndex = currentStatement ? currentStatement->m_statementIndex : Js::Constants::NoStatementIndex;
                    lastOpHelperFunc = currentStatement ? currentStatement->m_func : nullptr;
                }
            }
            else if (lastOpHelperLabel != NULL)
            {
                IR::Instr * prevInstr = lastOpHelperLabel->GetPrevRealInstrOrLabel();
                if (prevInstr->IsBranchInstr())
                {
                    // If the previous instruction is to jump around this helper block
                    // Then we move the helper block to the end of the function to
                    // avoid the jmp in the fast path.

                    //      jxx $label          <== prevInstr
                    // $helper:                 <== lastOpHelperLabel
                    //      ...
                    //      ...                 <== lastOpHelperInstr
                    // $label:                  <== labelInstr

                    IR::BranchInstr * prevBranchInstr = prevInstr->AsBranchInstr();
                    if (prevBranchInstr->GetTarget() == labelInstr)
                    {
                        lastInstr = this->MoveHelperBlock(lastOpHelperLabel, lastOpHelperStatementIndex, lastOpHelperFunc, labelInstr, lastInstr);


                        if (prevBranchInstr->IsUnconditional())
                        {
                            // Remove the branch to next after the helper block is moved.
                            prevBranchInstr->Remove();
                        }
                        else
                        {
                            // Reverse the condition
                            LowererMD::InvertBranch(prevBranchInstr);
                            prevBranchInstr->SetTarget(lastOpHelperLabel);
                        }
                    }
                    else if (prevBranchInstr->IsUnconditional())
                    {
                        IR::Instr * prevPrevInstr = prevInstr->GetPrevRealInstrOrLabel();
                        if (prevPrevInstr->IsBranchInstr()
                            && prevPrevInstr->AsBranchInstr()->IsConditional()
                            && prevPrevInstr->AsBranchInstr()->GetTarget() == labelInstr)
                        {

                            //      jcc $label          <== prevPrevInstr
                            //      jmp $blah           <== prevInstr
                            // $helper:                 <== lastOpHelperLabel
                            //      ...
                            //      ...                 <== lastOpHelperInstr
                            // $label:                  <== labelInstr

                            // Transform to

                            //      jncc $blah          <== prevPrevInstr
                            // $label:                  <== labelInstr

                            // $helper:                 <== lastOpHelperLabel
                            //      ...
                            //      ...                 <== lastOpHelperInstr
                            //      jmp $label:         <== labelInstr

                            lastInstr = this->MoveHelperBlock(lastOpHelperLabel, lastOpHelperStatementIndex, lastOpHelperFunc, labelInstr, lastInstr);

                            LowererMD::InvertBranch(prevPrevInstr->AsBranchInstr());
                            prevPrevInstr->AsBranchInstr()->SetTarget(prevBranchInstr->GetTarget());
                            prevBranchInstr->Remove();
                        }
                        else
                        {
                            IR::Instr *lastOpHelperInstr = labelInstr->GetPrevRealInstr();
                            if (lastOpHelperInstr->IsBranchInstr())
                            {
                                IR::BranchInstr *lastOpHelperBranchInstr = lastOpHelperInstr->AsBranchInstr();

                                //      jmp $target         <== prevInstr           //this is unconditional jump
                                // $helper:                 <== lastOpHelperLabel
                                //      ...
                                //      jmp $labeln         <== lastOpHelperInstr   //Conditional/Unconditional jump
                                // $label:                  <== labelInstr

                                lastInstr = this->MoveHelperBlock(lastOpHelperLabel, lastOpHelperStatementIndex, lastOpHelperFunc, labelInstr, lastInstr);
                                //Compensation code if its not unconditional jump
                                if (!lastOpHelperBranchInstr->IsUnconditional())
                                {
                                    IR::BranchInstr *branchInstr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelInstr, this->func);
                                    lastOpHelperBranchInstr->InsertAfter(branchInstr);
                                }
                            }

                        }
                    }
                }
                lastOpHelperLabel = NULL;
            }
        }
    }
    NEXT_INSTR_EDITING_IN_RANGE;

    func->m_tailInstr = lastInstr;
}